

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

void __thiscall
ear::QuadRegion::QuadRegion(QuadRegion *this,VectorXi *outputChannels,MatrixXd *positions)

{
  MatrixTypeNested __ptr;
  int *piVar1;
  undefined8 *puVar2;
  long lVar3;
  QuadRegion *pQVar4;
  Matrix3d *pMVar5;
  Matrix3d *pMVar6;
  byte bVar7;
  MatrixXd reorderedAndShiftedPositions;
  MatrixXd reorderedPositions;
  assign_op<double,_double> local_109;
  undefined1 local_108 [40];
  _func_int **local_e0 [2];
  variable_if_dynamic<long,__1> local_d0;
  Matrix3d local_c8;
  DenseStorage<double,__1,__1,__1,_0> local_80;
  DenseStorage<double,__1,__1,__1,_0> local_68;
  DenseStorage<double,__1,__1,__1,_0> local_50;
  DenseStorage<double,__1,__1,__1,_0> local_38;
  
  bVar7 = 0;
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<int,__1,__1,_1,_0> *)(local_108 + 0x18),
             (DenseStorage<int,__1,__1,_1,_0> *)outputChannels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_38,(DenseStorage<double,__1,__1,__1,_0> *)positions);
  RegionHandler::RegionHandler
            (&this->super_RegionHandler,(VectorXi *)(local_108 + 0x18),(MatrixXd *)&local_38);
  free(local_38.m_data);
  free((void *)local_108._24_8_);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_0019a7b0;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_50,(DenseStorage<double,__1,__1,__1,_0> *)positions);
  ngonVertexOrder((ear *)&local_c8,(MatrixXd *)&local_50);
  __ptr = (MatrixTypeNested)
          (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[0];
  piVar1 = (int *)(this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1];
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)__ptr;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)piVar1;
  free(__ptr);
  free(local_50.m_data);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator()
            ((type *)&local_c8,positions,&this->_order,(all_t *)&Eigen::all);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::internal::AllRange<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e0,
             (DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::AllRange<_1>_>_>
              *)&local_c8);
  free((void *)local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1]);
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.24399158242461e-314;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (double)local_d0.m_value;
  local_108._0_8_ = (_func_int **)0x0;
  local_108._8_8_ = (int *)0x0;
  local_108._16_8_ = 0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_e0;
  if (local_d0.m_value != 0) {
    if (3 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_d0.m_value),0)
       ) {
      if (local_d0.m_value < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if ((ulong)local_d0.m_value >> 0x3d == 0) goto LAB_0013c835;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::ios::widen;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
LAB_0013c835:
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_108,local_d0.m_value * 4,4,
             local_d0.m_value);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_108,
             (IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>
              *)&local_c8,&local_109);
  pQVar4 = (QuadRegion *)local_e0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_68,(DenseStorage<double,__1,__1,__1,_0> *)pQVar4);
  _calcPolyBasis(&local_c8,pQVar4,(MatrixXd *)&local_68);
  pMVar5 = &local_c8;
  pMVar6 = &this->_polyBasisX;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar6 = (Matrix3d *)((long)pMVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  free(local_68.m_data);
  pQVar4 = (QuadRegion *)local_108;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_80,(DenseStorage<double,__1,__1,__1,_0> *)pQVar4);
  _calcPolyBasis(&local_c8,pQVar4,(MatrixXd *)&local_80);
  pMVar5 = &local_c8;
  pMVar6 = &this->_polyBasisY;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar5 = (Matrix3d *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar6 = (Matrix3d *)((long)pMVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  free(local_80.m_data);
  free((void *)local_108._0_8_);
  free(local_e0[0]);
  return;
}

Assistant:

QuadRegion::QuadRegion(Eigen::VectorXi outputChannels,
                         Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    _order = ngonVertexOrder(positions);
    Eigen::MatrixXd reorderedPositions =
        positions(_order, Eigen::indexing::all);
    Eigen::MatrixXd reorderedAndShiftedPositions =
        reorderedPositions(Eigen::Vector4i{1, 2, 3, 0}, Eigen::indexing::all);
    _polyBasisX = _calcPolyBasis(reorderedPositions);
    _polyBasisY = _calcPolyBasis(reorderedAndShiftedPositions);
  }